

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O0

void __thiscall Color::Color(Color *this,string *str)

{
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  const_reference pvVar4;
  LandstalkerException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  long local_340;
  stringstream ss_1;
  ostream local_330 [392];
  long local_1a8;
  stringstream ss;
  ostream local_198 [378];
  uint8_t local_1e [2];
  uint8_t local_1c [2];
  uint8_t local_1a [2];
  uint16_t b;
  uint16_t g;
  string *psStack_18;
  uint16_t r;
  string *str_local;
  Color *this_local;
  
  this->_r = '\0';
  this->_g = '\0';
  this->_b = '\0';
  this->_invalid = true;
  psStack_18 = str;
  str_local = (string *)this;
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(str)
  ;
  if ((sVar2 == 4) &&
     (bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              starts_with(psStack_18,'#'), bVar1)) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1a8);
    poVar3 = (ostream *)std::ostream::operator<<(local_198,std::hex);
    pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](psStack_18,1);
    std::operator<<(poVar3,*pvVar4);
    std::istream::operator>>(&local_1a8,(ushort *)local_1a);
    std::ios::clear((int)&local_1a8 + (int)*(undefined8 *)(local_1a8 + -0x18));
    poVar3 = (ostream *)std::ostream::operator<<(local_198,std::hex);
    pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](psStack_18,2);
    std::operator<<(poVar3,*pvVar4);
    std::istream::operator>>(&local_1a8,(ushort *)local_1c);
    std::ios::clear((int)&local_1a8 + (int)*(undefined8 *)(local_1a8 + -0x18));
    poVar3 = (ostream *)std::ostream::operator<<(local_198,std::hex);
    pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](psStack_18,3);
    std::operator<<(poVar3,*pvVar4);
    std::istream::operator>>(&local_1a8,(ushort *)local_1e);
    rgb(this,local_1a[0] << 4,local_1c[0] << 4,local_1e[0] << 4);
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a8);
  }
  else {
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (psStack_18);
    if ((sVar2 != 7) ||
       (bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                starts_with(psStack_18,'#'), !bVar1)) {
      this_00 = (LandstalkerException *)__cxa_allocate_exception(0x28);
      std::operator+(&local_380,"Could not parse Color from string \'",psStack_18);
      std::operator+(&local_360,&local_380,"\'. Valid formats are \"#RGB\" and \"#RRGGBB\"");
      LandstalkerException::LandstalkerException(this_00,&local_360);
      __cxa_throw(this_00,&LandstalkerException::typeinfo,
                  LandstalkerException::~LandstalkerException);
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&local_340);
    poVar3 = (ostream *)std::ostream::operator<<(local_330,std::hex);
    pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](psStack_18,1);
    poVar3 = std::operator<<(poVar3,*pvVar4);
    pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](psStack_18,2);
    std::operator<<(poVar3,*pvVar4);
    std::istream::operator>>(&local_340,(ushort *)local_1a);
    std::ios::clear((int)&local_340 + (int)*(undefined8 *)(local_340 + -0x18));
    poVar3 = (ostream *)std::ostream::operator<<(local_330,std::hex);
    pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](psStack_18,3);
    poVar3 = std::operator<<(poVar3,*pvVar4);
    pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](psStack_18,4);
    std::operator<<(poVar3,*pvVar4);
    std::istream::operator>>(&local_340,(ushort *)local_1c);
    std::ios::clear((int)&local_340 + (int)*(undefined8 *)(local_340 + -0x18));
    poVar3 = (ostream *)std::ostream::operator<<(local_330,std::hex);
    pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](psStack_18,5);
    poVar3 = std::operator<<(poVar3,*pvVar4);
    pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](psStack_18,6);
    std::operator<<(poVar3,*pvVar4);
    std::istream::operator>>(&local_340,(ushort *)local_1e);
    rgb(this,local_1a[0],local_1c[0],local_1e[0]);
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_340);
  }
  return;
}

Assistant:

Color::Color(const std::string& str)
{
    uint16_t r, g, b;
    if(str.size() == 4 && str.starts_with('#'))
    {
        // Format 1 : "#RGB"
        std::stringstream ss;
        ss << std::hex << str[1];
        ss >> r;
        ss.clear();
        ss << std::hex << str[2];
        ss >> g;
        ss.clear();
        ss << std::hex << str[3];
        ss >> b;

        this->rgb((uint8_t)r << 4, (uint8_t)g << 4, (uint8_t)b << 4);
    }
    else if(str.size() == 7 && str.starts_with('#'))
    {
        // Format 2 : "#RRGGBB"
        std::stringstream ss;
        ss << std::hex << str[1] << str[2];
        ss >> r;
        ss.clear();
        ss << std::hex << str[3] << str[4];
        ss >> g;
        ss.clear();
        ss << std::hex << str[5] << str[6];
        ss >> b;

        this->rgb((uint8_t)r, (uint8_t)g, (uint8_t)b);
    }
    else
    {
        throw LandstalkerException("Could not parse Color from string '" + str + "'. "
                                   "Valid formats are \"#RGB\" and \"#RRGGBB\"");
    }
}